

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_finite_automaton.cpp
# Opt level: O2

ostream * Omega_h::operator<<(ostream *os,FiniteAutomaton *fa)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  char *pcVar6;
  int symbol;
  
  pcVar6 = "nfa ";
  if (fa->is_deterministic != false) {
    pcVar6 = "dfa ";
  }
  std::operator<<(os,pcVar6);
  iVar1 = get_nrows<int>(&fa->table);
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)os,iVar1);
  poVar5 = std::operator<<(poVar5," states ");
  poVar5 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)poVar5,(fa->table).ncols + (uint)fa->is_deterministic * 2 + -2);
  std::operator<<(poVar5," symbols\n");
  iVar1 = 0;
  while( true ) {
    iVar2 = get_nrows<int>(&fa->table);
    if (iVar2 <= iVar1) break;
    for (iVar2 = 0; iVar2 < (int)((fa->table).ncols + (uint)fa->is_deterministic * 2 + -2);
        iVar2 = iVar2 + 1) {
      iVar3 = step(fa,iVar1,iVar2);
      if (iVar3 != -1) {
        poVar5 = std::operator<<(os,"(");
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,iVar1);
        poVar5 = std::operator<<(poVar5,", ");
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,iVar2);
        poVar5 = std::operator<<(poVar5,") -> ");
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,iVar3);
        std::operator<<(poVar5,'\n');
      }
    }
    if (fa->is_deterministic == false) {
      iVar2 = get_epsilon0(fa);
      while( true ) {
        iVar3 = get_epsilon1(fa);
        if (iVar3 < iVar2) break;
        iVar3 = step(fa,iVar1,iVar2);
        if (iVar3 != -1) {
          poVar5 = std::operator<<(os,"(");
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,iVar1);
          poVar5 = std::operator<<(poVar5,", eps");
          iVar4 = get_epsilon0(fa);
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,iVar2 - iVar4);
          poVar5 = std::operator<<(poVar5,") -> ");
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,iVar3);
          std::operator<<(poVar5,'\n');
        }
        iVar2 = iVar2 + 1;
      }
    }
    iVar2 = accepts(fa,iVar1);
    if (iVar2 != -1) {
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)os,iVar1);
      poVar5 = std::operator<<(poVar5," accepts ");
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,iVar2);
      std::operator<<(poVar5,'\n');
    }
    iVar1 = iVar1 + 1;
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, FiniteAutomaton const& fa) {
  if (get_determinism(fa))
    os << "dfa ";
  else
    os << "nfa ";
  os << get_nstates(fa) << " states " << get_nsymbols(fa) << " symbols\n";
  for (int state = 0; state < get_nstates(fa); ++state) {
    for (int symbol = 0; symbol < get_nsymbols(fa); ++symbol) {
      auto next_state = step(fa, state, symbol);
      if (next_state != -1)
        os << "(" << state << ", " << symbol << ") -> " << next_state << '\n';
    }
    if (!get_determinism(fa)) {
      for (int symbol = get_epsilon0(fa); symbol <= get_epsilon1(fa);
           ++symbol) {
        auto next_state = step(fa, state, symbol);
        if (next_state != -1)
          os << "(" << state << ", eps" << (symbol - get_epsilon0(fa))
             << ") -> " << next_state << '\n';
      }
    }
    auto token = accepts(fa, state);
    if (token != -1) os << state << " accepts " << token << '\n';
  }
  return os;
}